

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksets_decoder.cpp
# Opt level: O3

uint16_t decode_tile(BitstreamReader *bitstream,TileQueue *tile_queue)

{
  byte bVar1;
  uint32_t uVar2;
  byte *pbVar3;
  byte bVar4;
  
  bVar4 = bitstream->_bit_position;
  pbVar3 = bitstream->_data;
  if ((char)bVar4 < '\0') {
    bitstream->_bit_position = '\a';
    pbVar3 = pbVar3 + 1;
    bitstream->_data = pbVar3;
    bitstream->_size = bitstream->_size + 1;
    bVar4 = 7;
  }
  bVar1 = *pbVar3;
  bitstream->_bit_position = bVar4 - 1;
  if ((bVar1 >> (bVar4 & 0x1f) & 1) == 0) {
    uVar2 = BitstreamReader::read_bits(bitstream,'\v');
    TileQueue::push_front(tile_queue,(uint16_t)uVar2);
  }
  else {
    uVar2 = BitstreamReader::read_bits(bitstream,'\x04');
    TileQueue::move_to_front(tile_queue,uVar2);
  }
  return *(tile_queue->_tiles).super__Deque_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
}

Assistant:

static uint16_t decode_tile(BitstreamReader& bitstream, TileQueue& tile_queue)
{
    if(bitstream.next_bit())
    {
        uint32_t index = bitstream.read_bits(4);
        tile_queue.move_to_front(index);
    }
    else
    {
        uint32_t val = bitstream.read_bits(11);
        tile_queue.push_front(val);
    }

    return tile_queue.front();
}